

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O2

void __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyTests::initPrograms
          (FilteringAnisotropyTests *this,SourceCollections *programCollection)

{
  Program local_2c;
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> programs;
  
  programs.
  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  programs.
  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  programs.
  super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c = PROGRAM_2D_FLOAT;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
  emplace_back<vkt::texture::util::Program>(&programs,&local_2c);
  util::initializePrograms(programCollection,PRECISION_HIGHP,&programs);
  std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
  ~_Vector_base(&programs.
                 super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               );
  return;
}

Assistant:

void			initPrograms				(SourceCollections&	programCollection) const
	{
		std::vector<util::Program>	programs;
		programs.push_back(util::PROGRAM_2D_FLOAT);
		initializePrograms(programCollection,glu::PRECISION_HIGHP, programs);
	}